

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O2

future<int> __thiscall prometheus::Gateway::async_push(Gateway *this,HttpMethod method)

{
  pointer ppVar1;
  pointer p_Var2;
  _Result<int> *p_Var3;
  pointer pcVar4;
  HttpMethod in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer *__ptr;
  undefined4 in_register_00000034;
  Gateway *this_00;
  _State_baseV2 *__tmp;
  _State_baseV2 *__tmp_2;
  pointer collectable_00;
  _State_baseV2 *__tmp_3;
  future<int> fVar5;
  __allocator_type __a2_3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_170 [2];
  __allocator_type __a2;
  __state_type local_158;
  __allocator_type __a2_1;
  vector<std::future<int>,_std::allocator<std::future<int>_>_> futures;
  string uri;
  __allocator_type __a2_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  pthread_mutex_t *local_e8;
  thread local_e0;
  undefined1 local_d8 [8];
  _Alloc_hider a_Stack_d0 [4];
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_b0;
  Gateway *local_a0;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> metrics;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> body;
  shared_ptr<prometheus::Collectable> collectable;
  Serializer local_48;
  __basic_future<int> local_40;
  
  this_00 = (Gateway *)CONCAT44(in_register_00000034,method);
  local_48._vptr_Serializer = (_func_int **)&PTR__Serializer_00126d08;
  futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = (pthread_mutex_t *)&this_00->mutex_;
  ::std::mutex::lock((mutex *)&local_e8->__data);
  ppVar1 = (this_00->collectables_).
           super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (collectable_00 =
            (this_00->collectables_).
            super__Vector_base<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start; collectable_00 != ppVar1;
      collectable_00 = collectable_00 + 1) {
    ::std::__shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&collectable.super___shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>,
               collectable_00);
    if (collectable.super___shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      (*(collectable.super___shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->_vptr_Collectable[2])(&metrics);
      Serializer::Serialize_abi_cxx11_((string *)local_d8,&local_48,&metrics);
      ::std::make_shared<std::__cxx11::string,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&body);
      ::std::__cxx11::string::~string((string *)local_d8);
      getUri(&uri,this_00,collectable_00);
      local_d8._0_4_ = in_EDX;
      ::std::__cxx11::string::string((string *)a_Stack_d0,(string *)&uri);
      ::std::
      __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_b0,
                     &body.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      local_158.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_158.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_a0 = this_00;
      p_Var2 = (pointer)operator_new(0x88);
      ___a2_3 = (element_type *)&__a2;
      (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00126420;
      *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = 0;
      *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x10) = 0;
      (p_Var2->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
      *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x18) = 0;
      *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20) = 0;
      *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x28) = 0;
      (p_Var2->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_00126470;
      a_Stack_170[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
      p_Var3 = (_Result<int> *)operator_new(0x18);
      ::std::__future_base::_Result<int>::_Result(p_Var3);
      *(_Result<int> **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x30) = p_Var3;
      ::std::thread::
      _Invoker<std::tuple<prometheus::Gateway::async_push(prometheus::detail::HttpMethod)::$_0>>::
      _Invoker<prometheus::Gateway::async_push(prometheus::detail::HttpMethod)::__0>
                ((_Invoker<std::tuple<prometheus::Gateway::async_push(prometheus::detail::HttpMethod)::__0>>
                  *)((p_Var2->_M_impl)._M_storage._M_storage.__data + 0x38),
                 (anon_class_64_4_87398893_for__M_head_impl *)local_d8);
      local_e0._M_id._M_thread = (id)0;
      ___a2_1 = (long *)operator_new(0x20);
      *___a2_1 = (long)&PTR___State_001264c8;
      ___a2_1[1] = (long)&p_Var2->_M_impl;
      ___a2_1[2] = (long)::std::__future_base::
                         _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:167:54)>_>,_int>
                         ::_M_run;
      ___a2_1[3] = 0;
      ::std::thread::_M_start_thread(&local_e0,&__a2_1,0);
      if (___a2_1 != (long *)0x0) {
        (**(code **)(*___a2_1 + 8))();
      }
      ::std::thread::operator=
                ((thread *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20),&local_e0);
      ::std::thread::~thread(&local_e0);
      a_Stack_170[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ::std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:167:54)>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:167:54)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:167:54)>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:167:54)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&__a2_3);
      ___a2_2 = 0;
      _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ___a2_3 = local_158.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      a_Stack_170[0]._M_pi =
           local_158.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      local_158.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&p_Var2->_M_impl;
      local_158.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_170);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
      if (local_158.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
        p_Var2 = (pointer)operator_new(0x78);
        ___a2_3 = (element_type *)&__a2_1;
        (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
        (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
        (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_00126508;
        *(undefined8 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = 0;
        *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x10) = 0;
        (p_Var2->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
        *(undefined4 *)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x18) = 0;
        (p_Var2->_M_impl)._M_storage._M_storage.__align =
             (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_00126558;
        a_Stack_170[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
        p_Var3 = (_Result<int> *)operator_new(0x18);
        ::std::__future_base::_Result<int>::_Result(p_Var3);
        *(_Result<int> **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 0x20) = p_Var3;
        ::std::thread::
        _Invoker<std::tuple<prometheus::Gateway::async_push(prometheus::detail::HttpMethod)::$_0>>::
        _Invoker<prometheus::Gateway::async_push(prometheus::detail::HttpMethod)::__0>
                  ((_Invoker<std::tuple<prometheus::Gateway::async_push(prometheus::detail::HttpMethod)::__0>>
                    *)((p_Var2->_M_impl)._M_storage._M_storage.__data + 0x28),
                   (anon_class_64_4_87398893_for__M_head_impl *)local_d8);
        a_Stack_170[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ::std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:167:54)>_>,_int>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:167:54)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:167:54)>_>,_int>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:167:54)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&__a2_3);
        ___a2_2 = 0;
        _Stack_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ___a2_3 = local_158.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        a_Stack_170[0]._M_pi =
             local_158.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        local_158.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&p_Var2->_M_impl;
        local_158.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_170);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f0);
      }
      ::std::__basic_future<int>::__basic_future(&local_40,&local_158);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_158.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::vector<std::future<int>,std::allocator<std::future<int>>>::
      emplace_back<std::future<int>>
                ((vector<std::future<int>,std::allocator<std::future<int>>> *)&futures,
                 (future<int> *)&local_40);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      async_push(prometheus::detail::HttpMethod)::$_0::~__0((__0 *)local_d8);
      ::std::__cxx11::string::~string((string *)&uri);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&body.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      ::std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
                (&metrics);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&collectable.super___shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  uri._M_dataplus._M_p = (pointer)0x0;
  uri._M_string_length = 0;
  pcVar4 = (pointer)operator_new(0x60);
  pcVar4[8] = '\x01';
  pcVar4[9] = '\0';
  pcVar4[10] = '\0';
  pcVar4[0xb] = '\0';
  pcVar4[0xc] = '\x01';
  pcVar4[0xd] = '\0';
  pcVar4[0xe] = '\0';
  pcVar4[0xf] = '\0';
  *(undefined ***)pcVar4 = &PTR___Sp_counted_ptr_inplace_001265a0;
  pcVar4[0x18] = '\0';
  pcVar4[0x19] = '\0';
  pcVar4[0x1a] = '\0';
  pcVar4[0x1b] = '\0';
  pcVar4[0x1c] = '\0';
  pcVar4[0x1d] = '\0';
  pcVar4[0x1e] = '\0';
  pcVar4[0x1f] = '\0';
  pcVar4[0x20] = '\0';
  pcVar4[0x21] = '\0';
  pcVar4[0x22] = '\0';
  pcVar4[0x23] = '\0';
  pcVar4[0x24] = '\0';
  pcVar4[0x28] = '\0';
  pcVar4[0x29] = '\0';
  pcVar4[0x2a] = '\0';
  pcVar4[0x2b] = '\0';
  local_d8 = (undefined1  [8])&__a2_2;
  pcVar4[0x30] = '\0';
  pcVar4[0x31] = '\0';
  pcVar4[0x32] = '\0';
  pcVar4[0x33] = '\0';
  pcVar4[0x34] = '\0';
  pcVar4[0x35] = '\0';
  pcVar4[0x36] = '\0';
  pcVar4[0x37] = '\0';
  pcVar4[0x38] = '\0';
  pcVar4[0x39] = '\0';
  pcVar4[0x3a] = '\0';
  pcVar4[0x3b] = '\0';
  *(undefined ***)(pcVar4 + 0x10) = &PTR___Async_state_impl_001265f0;
  a_Stack_d0[0]._M_p = pcVar4;
  p_Var3 = (_Result<int> *)operator_new(0x18);
  ::std::__future_base::_Result<int>::_Result(p_Var3);
  *(_Result<int> **)(pcVar4 + 0x40) = p_Var3;
  *(pointer *)(pcVar4 + 0x48) =
       futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(pcVar4 + 0x50) =
       futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(pcVar4 + 0x58) =
       futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  ___a2_3 = (element_type *)operator_new(0x20);
  *(undefined ***)___a2_3 = &PTR___State_00126648;
  *(pointer *)((long)___a2_3 + 8) = pcVar4 + 0x10;
  *(code **)((long)___a2_3 + 0x10) =
       ::std::__future_base::
       _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:172:30),_std::vector<std::future<int>,_std::allocator<std::future<int>_>_>_>_>,_int>
       ::_M_run;
  *(long *)((long)___a2_3 + 0x18) = 0;
  ::std::thread::_M_start_thread(&local_158,&__a2_3,0);
  if (___a2_3 != (element_type *)0x0) {
    (**(code **)(*(long *)___a2_3 + 8))();
  }
  ::std::thread::operator=((thread *)(pcVar4 + 0x30),(thread *)&local_158);
  ::std::thread::~thread((thread *)&local_158);
  a_Stack_d0[0]._M_p = (pointer)0x0;
  ::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:172:30),_std::vector<std::future<int>,_std::allocator<std::future<int>_>_>_>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:172:30),_std::vector<std::future<int>,_std::allocator<std::future<int>_>_>_>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:172:30),_std::vector<std::future<int>,_std::allocator<std::future<int>_>_>_>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:172:30),_std::vector<std::future<int>,_std::allocator<std::future<int>_>_>_>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_d8);
  metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8 = (undefined1  [8])uri._M_dataplus._M_p;
  a_Stack_d0[0]._M_p = (pointer)uri._M_string_length;
  uri._M_dataplus._M_p = pcVar4 + 0x10;
  uri._M_string_length = (size_type)pcVar4;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_d0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &metrics.
              super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  if (uri._M_dataplus._M_p == (pointer)0x0) {
    pcVar4 = (pointer)operator_new(0x50);
    pcVar4[8] = '\x01';
    pcVar4[9] = '\0';
    pcVar4[10] = '\0';
    pcVar4[0xb] = '\0';
    pcVar4[0xc] = '\x01';
    pcVar4[0xd] = '\0';
    pcVar4[0xe] = '\0';
    pcVar4[0xf] = '\0';
    *(undefined ***)pcVar4 = &PTR___Sp_counted_ptr_inplace_00126688;
    pcVar4[0x18] = '\0';
    pcVar4[0x19] = '\0';
    pcVar4[0x1a] = '\0';
    pcVar4[0x1b] = '\0';
    pcVar4[0x1c] = '\0';
    pcVar4[0x1d] = '\0';
    pcVar4[0x1e] = '\0';
    pcVar4[0x1f] = '\0';
    pcVar4[0x20] = '\0';
    pcVar4[0x21] = '\0';
    pcVar4[0x22] = '\0';
    pcVar4[0x23] = '\0';
    pcVar4[0x24] = '\0';
    pcVar4[0x28] = '\0';
    pcVar4[0x29] = '\0';
    pcVar4[0x2a] = '\0';
    pcVar4[0x2b] = '\0';
    *(undefined ***)(pcVar4 + 0x10) = &PTR___Deferred_state_001266d8;
    local_d8 = (undefined1  [8])&__a2_3;
    a_Stack_d0[0]._M_p = pcVar4;
    p_Var3 = (_Result<int> *)operator_new(0x18);
    ::std::__future_base::_Result<int>::_Result(p_Var3);
    *(_Result<int> **)(pcVar4 + 0x30) = p_Var3;
    *(pointer *)(pcVar4 + 0x38) =
         futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)(pcVar4 + 0x40) =
         futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    *(pointer *)(pcVar4 + 0x48) =
         futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    futures.super__Vector_base<std::future<int>,_std::allocator<std::future<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    a_Stack_d0[0]._M_p = (pointer)0x0;
    ::std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:172:30),_std::vector<std::future<int>,_std::allocator<std::future<int>_>_>_>_>,_int>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:172:30),_std::vector<std::future<int>,_std::allocator<std::future<int>_>_>_>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:172:30),_std::vector<std::future<int>,_std::allocator<std::future<int>_>_>_>_>,_int>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:172:30),_std::vector<std::future<int>,_std::allocator<std::future<int>_>_>_>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)local_d8);
    metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    metrics.super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8 = (undefined1  [8])uri._M_dataplus._M_p;
    a_Stack_d0[0]._M_p = (pointer)uri._M_string_length;
    uri._M_dataplus._M_p = pcVar4 + 0x10;
    uri._M_string_length = (size_type)pcVar4;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_d0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &metrics.
                super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  ::std::__basic_future<int>::__basic_future((__basic_future<int> *)this,(__state_type *)&uri);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&uri._M_string_length);
  pthread_mutex_unlock(local_e8);
  ::std::vector<std::future<int>,_std::allocator<std::future<int>_>_>::~vector(&futures);
  fVar5.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  fVar5.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<int>)
         fVar5.super___basic_future<int>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::future<int> Gateway::async_push(detail::HttpMethod method) {
  const auto serializer = TextSerializer{};
  std::vector<std::future<int>> futures;

  std::lock_guard<std::mutex> lock{mutex_};
  for (auto& wcollectable : collectables_) {
    auto collectable = wcollectable.first.lock();
    if (!collectable) {
      continue;
    }

    auto metrics = collectable->Collect();
    auto body = std::make_shared<std::string>(serializer.Serialize(metrics));
    auto uri = getUri(wcollectable);

    futures.push_back(std::async(std::launch::async, [method, uri, body, this] {
      return curlWrapper_->performHttpRequest(method, uri, *body);
    }));
  }

  const auto reduceFutures = [](std::vector<std::future<int>> lfutures) {
    auto final_status_code = 200;

    for (auto& future : lfutures) {
      auto status_code = future.get();

      if (status_code < 100 || status_code >= 400) {
        final_status_code = status_code;
      }
    }

    return final_status_code;
  };

  return std::async(std::launch::async, reduceFutures, std::move(futures));
}